

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_table_as_root(void *buf,size_t bufsiz,char *fid,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  
  iVar1 = flatcc_verify_buffer_header(buf,bufsiz,fid);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = verify_table(buf,(flatbuffers_uoffset_t)bufsiz,0,*buf,100,tvf);
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_root(const void *buf, size_t bufsiz, const char *fid, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, (uoffset_t)bufsiz, 0, read_uoffset(buf, 0), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}